

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O2

void __thiscall aiAnimation::~aiAnimation(aiAnimation *this)

{
  aiNodeAnim **ppaVar1;
  aiNodeAnim *this_00;
  aiMeshAnim **ppaVar2;
  aiMeshAnim *this_01;
  aiMeshMorphAnim **ppaVar3;
  aiMeshMorphAnim *this_02;
  uint uVar4;
  uint a;
  ulong uVar5;
  
  uVar4 = this->mNumChannels;
  if ((uVar4 != 0) && (this->mChannels != (aiNodeAnim **)0x0)) {
    for (uVar5 = 0; ppaVar1 = this->mChannels, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      this_00 = ppaVar1[uVar5];
      if (this_00 != (aiNodeAnim *)0x0) {
        aiNodeAnim::~aiNodeAnim(this_00);
      }
      operator_delete(this_00);
      uVar4 = this->mNumChannels;
    }
    if (ppaVar1 != (aiNodeAnim **)0x0) {
      operator_delete__(ppaVar1);
    }
  }
  uVar4 = this->mNumMeshChannels;
  if ((uVar4 != 0) && (this->mMeshChannels != (aiMeshAnim **)0x0)) {
    for (uVar5 = 0; ppaVar2 = this->mMeshChannels, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      this_01 = ppaVar2[uVar5];
      if (this_01 != (aiMeshAnim *)0x0) {
        aiMeshAnim::~aiMeshAnim(this_01);
      }
      operator_delete(this_01);
      uVar4 = this->mNumMeshChannels;
    }
    if (ppaVar2 != (aiMeshAnim **)0x0) {
      operator_delete__(ppaVar2);
    }
  }
  uVar4 = this->mNumMorphMeshChannels;
  if ((uVar4 != 0) && (this->mMorphMeshChannels != (aiMeshMorphAnim **)0x0)) {
    for (uVar5 = 0; ppaVar3 = this->mMorphMeshChannels, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      this_02 = ppaVar3[uVar5];
      if (this_02 != (aiMeshMorphAnim *)0x0) {
        aiMeshMorphAnim::~aiMeshMorphAnim(this_02);
      }
      operator_delete(this_02);
      uVar4 = this->mNumMorphMeshChannels;
    }
    if (ppaVar3 != (aiMeshMorphAnim **)0x0) {
      operator_delete__(ppaVar3);
      return;
    }
  }
  return;
}

Assistant:

~aiAnimation() {
        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if ( mNumChannels && mChannels )  {
            for( unsigned int a = 0; a < mNumChannels; a++) {
                delete mChannels[ a ];
            }

            delete [] mChannels;
        }
        if (mNumMeshChannels && mMeshChannels)  {
            for( unsigned int a = 0; a < mNumMeshChannels; a++) {
                delete mMeshChannels[a];
            }

            delete [] mMeshChannels;
        }
        if (mNumMorphMeshChannels && mMorphMeshChannels) {
                for( unsigned int a = 0; a < mNumMorphMeshChannels; a++) {
                        delete mMorphMeshChannels[a];
                }
            
            delete [] mMorphMeshChannels;
        }
    }